

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_draw_command * nk_draw_list_command_last(nk_draw_list *list)

{
  nk_buffer *pnVar1;
  nk_size nVar2;
  void *pvVar3;
  
  pnVar1 = list->buffer;
  if (pnVar1 == (nk_buffer *)0x0) {
    pvVar3 = (void *)0x0;
    nVar2 = 0;
  }
  else {
    pvVar3 = (pnVar1->memory).ptr;
    nVar2 = (pnVar1->memory).size;
  }
  return (nk_draw_command *)
         ((long)pvVar3 + (ulong)(list->cmd_count - 1) * -0x20 + (nVar2 - list->cmd_offset));
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_command_last(struct nk_draw_list *list)
{
void *memory;
nk_size size;
struct nk_draw_command *cmd;
NK_ASSERT(list->cmd_count);

memory = nk_buffer_memory(list->buffer);
size = nk_buffer_total(list->buffer);
cmd = nk_ptr_add(struct nk_draw_command, memory, size - list->cmd_offset);
return (cmd - (list->cmd_count-1));
}